

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack4.h
# Opt level: O2

void ncnn::im2col_sgemm_pack4_sse
               (Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  uint uVar5;
  uint uVar6;
  char cVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  int *piVar12;
  int iVar13;
  long lVar14;
  _func_int ***ppp_Var15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  float *pfVar21;
  ulong uVar22;
  int q;
  ulong uVar23;
  uint uVar24;
  undefined1 (*pauVar25) [16];
  uint uVar26;
  long lVar27;
  ulong uVar28;
  long lVar29;
  int iVar30;
  undefined1 (*pauVar31) [16];
  bool bVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 local_b8 [64];
  size_t local_78;
  ulong local_68;
  ulong local_60;
  Mat *local_58;
  void *local_50;
  float zeros [4];
  
  uVar5 = bottom_im2col->w;
  lVar14 = (long)(int)uVar5;
  uVar6 = bottom_im2col->h;
  uVar16 = bottom_im2col->c;
  local_60 = (ulong)(uint)top_blob->c;
  local_50 = _bias->data;
  local_78 = 0;
  local_b8._0_8_ = (Allocator *)0x0;
  local_b8._8_4_ = 0;
  local_b8._12_4_ = 0;
  local_b8._16_8_ = SUB168(ZEXT816(0) << 0x40,4);
  local_b8._24_4_ = 0;
  local_b8._48_12_ = SUB1612(ZEXT816(0) << 0x40,4);
  if (lVar14 < 0xc) {
    if ((int)uVar5 < 8) {
      if ((int)uVar5 < 4) {
        uVar24 = uVar6;
        uVar26 = uVar5;
        if (1 < (int)uVar5) {
          uVar24 = uVar6 * 2;
          uVar26 = (uVar5 & 1) + 1;
        }
      }
      else {
        uVar24 = uVar6 * 4;
        uVar26 = (uVar5 & 1) + 1 + (uint)((uVar5 >> 1 & 1) != 0);
      }
    }
    else {
      uVar24 = uVar6 * 8;
      uVar26 = (uVar5 & 1) + 1 + (uVar5 >> 2 & 1) + (uint)((uVar5 >> 1 & 1) != 0);
    }
  }
  else {
    uVar19 = (ulong)uVar5 % 0xc;
    uVar24 = uVar6 * 0xc;
    uVar26 = ((uint)uVar19 & 1) + (int)(uVar19 >> 3) + uVar5 / 0xc + ((uint)(uVar19 >> 2) & 1) +
             (uint)(((uint)uVar19 >> 1 & 1) != 0);
  }
  local_b8._32_8_ = local_b8._0_8_;
  local_b8._40_4_ = local_b8._8_4_;
  local_b8._44_4_ = local_b8._12_4_;
  local_58 = top_blob;
  Mat::create((Mat *)local_b8,uVar24,uVar16,uVar26,0x10,4,opt->workspace_allocator);
  uVar19 = 0;
  uVar24 = 0;
  if (0 < (int)uVar6) {
    uVar24 = uVar6;
  }
  uVar28 = 0;
  if (0 < (int)uVar16) {
    uVar28 = (ulong)uVar16;
  }
  iVar30 = (int)((long)(int)uVar5 / 0xc);
  uVar17 = 0;
  if (0 < iVar30) {
    uVar17 = (long)(int)uVar5 / 0xc & 0xffffffff;
  }
  lVar29 = (long)(int)(uVar5 * 4) * 4;
  for (; uVar19 != uVar17; uVar19 = uVar19 + 1) {
    ppp_Var15 = (_func_int ***)
                ((long)(_func_int ***)local_b8._0_8_ + local_78 * uVar19 * local_b8._16_8_);
    for (uVar23 = 0; uVar23 != uVar28; uVar23 = uVar23 + 1) {
      pauVar25 = (undefined1 (*) [16])
                 ((long)bottom_im2col->data +
                 bottom_im2col->cstep * bottom_im2col->elemsize * uVar23 +
                 ((long)(uVar19 * 0x3000000000) >> 0x1e) + 0xb0);
      uVar26 = uVar24;
      while (bVar32 = uVar26 != 0, uVar26 = uVar26 - 1, bVar32) {
        auVar38 = vunpcklps_avx(pauVar25[-0xb],pauVar25[-10]);
        auVar36 = vunpcklps_avx(pauVar25[-9],pauVar25[-8]);
        auVar37 = vunpckhps_avx(pauVar25[-0xb],pauVar25[-10]);
        auVar42 = vunpckhps_avx(pauVar25[-9],pauVar25[-8]);
        auVar33 = vmovlhps_avx(auVar38,auVar36);
        auVar45 = vunpckhpd_avx(auVar38,auVar36);
        auVar38 = vmovlhps_avx(auVar37,auVar42);
        auVar48 = vunpckhpd_avx(auVar37,auVar42);
        auVar42 = vunpcklps_avx(pauVar25[-7],pauVar25[-6]);
        auVar35 = vunpcklps_avx(pauVar25[-5],pauVar25[-4]);
        auVar36 = vunpckhps_avx(pauVar25[-7],pauVar25[-6]);
        auVar41 = vunpckhps_avx(pauVar25[-5],pauVar25[-4]);
        auVar37 = vmovlhps_avx(auVar42,auVar35);
        auVar35 = vunpckhpd_avx(auVar42,auVar35);
        auVar42 = vmovlhps_avx(auVar36,auVar41);
        auVar40 = vunpckhpd_avx(auVar36,auVar41);
        auVar41 = vunpcklps_avx(pauVar25[-3],pauVar25[-2]);
        auVar44 = vunpcklps_avx(pauVar25[-1],*pauVar25);
        auVar34 = vunpckhps_avx(pauVar25[-3],pauVar25[-2]);
        auVar39 = vunpckhps_avx(pauVar25[-1],*pauVar25);
        auVar36 = vmovlhps_avx(auVar41,auVar44);
        auVar44 = vunpckhpd_avx(auVar41,auVar44);
        auVar41 = vmovlhps_avx(auVar34,auVar39);
        auVar34 = vunpckhpd_avx(auVar34,auVar39);
        *(undefined1 (*) [16])ppp_Var15 = auVar33;
        *(undefined1 (*) [16])(ppp_Var15 + 2) = auVar37;
        *(undefined1 (*) [16])(ppp_Var15 + 4) = auVar36;
        *(undefined1 (*) [16])(ppp_Var15 + 6) = auVar45;
        *(undefined1 (*) [16])(ppp_Var15 + 8) = auVar35;
        *(undefined1 (*) [16])(ppp_Var15 + 10) = auVar44;
        *(undefined1 (*) [16])(ppp_Var15 + 0xc) = auVar38;
        *(undefined1 (*) [16])(ppp_Var15 + 0xe) = auVar42;
        *(undefined1 (*) [16])(ppp_Var15 + 0x10) = auVar41;
        *(undefined1 (*) [16])(ppp_Var15 + 0x12) = auVar48;
        *(undefined1 (*) [16])(ppp_Var15 + 0x14) = auVar40;
        *(undefined1 (*) [16])(ppp_Var15 + 0x16) = auVar34;
        ppp_Var15 = ppp_Var15 + 0x18;
        pauVar25 = (undefined1 (*) [16])(*pauVar25 + lVar29);
      }
    }
  }
  iVar30 = iVar30 * 0xc;
  uVar26 = (int)uVar5 % 0xc >> 3;
  uVar17 = 0;
  uVar19 = (ulong)uVar26;
  if ((int)uVar26 < 1) {
    uVar19 = uVar17;
  }
  lVar18 = (long)iVar30 * 0x10 + 0x40;
  for (; uVar17 != uVar19; uVar17 = uVar17 + 1) {
    iVar13 = iVar30 + (int)uVar17 * 8;
    ppp_Var15 = (_func_int ***)
                ((long)(_func_int ***)local_b8._0_8_ +
                (long)((int)(char)((char)(iVar13 % 0xc) / '\b') + iVar13 / 0xc) * local_78 *
                local_b8._16_8_);
    for (uVar23 = 0; uVar23 != uVar28; uVar23 = uVar23 + 1) {
      pauVar25 = (undefined1 (*) [16])
                 ((long)bottom_im2col->data +
                 bottom_im2col->cstep * bottom_im2col->elemsize * uVar23 + lVar18);
      uVar26 = uVar24;
      while (bVar32 = uVar26 != 0, uVar26 = uVar26 - 1, bVar32) {
        auVar38 = vunpcklps_avx(pauVar25[-4],pauVar25[-3]);
        auVar36 = vunpcklps_avx(pauVar25[-2],pauVar25[-1]);
        auVar37 = vunpckhps_avx(pauVar25[-4],pauVar25[-3]);
        auVar42 = vunpckhps_avx(pauVar25[-2],pauVar25[-1]);
        auVar33 = vmovlhps_avx(auVar38,auVar36);
        auVar36 = vunpckhpd_avx(auVar38,auVar36);
        auVar38 = vmovlhps_avx(auVar37,auVar42);
        auVar41 = vunpckhpd_avx(auVar37,auVar42);
        auVar42 = vunpcklps_avx(*pauVar25,pauVar25[1]);
        auVar45 = vunpcklps_avx(pauVar25[2],pauVar25[3]);
        auVar48 = vunpckhps_avx(*pauVar25,pauVar25[1]);
        auVar35 = vunpckhps_avx(pauVar25[2],pauVar25[3]);
        auVar37 = vmovlhps_avx(auVar42,auVar45);
        auVar45 = vunpckhpd_avx(auVar42,auVar45);
        auVar42 = vmovlhps_avx(auVar48,auVar35);
        auVar48 = vunpckhpd_avx(auVar48,auVar35);
        *(undefined1 (*) [16])ppp_Var15 = auVar33;
        *(undefined1 (*) [16])(ppp_Var15 + 2) = auVar37;
        *(undefined1 (*) [16])(ppp_Var15 + 4) = auVar36;
        *(undefined1 (*) [16])(ppp_Var15 + 6) = auVar45;
        *(undefined1 (*) [16])(ppp_Var15 + 8) = auVar38;
        *(undefined1 (*) [16])(ppp_Var15 + 10) = auVar42;
        *(undefined1 (*) [16])(ppp_Var15 + 0xc) = auVar41;
        *(undefined1 (*) [16])(ppp_Var15 + 0xe) = auVar48;
        ppp_Var15 = ppp_Var15 + 0x10;
        pauVar25 = (undefined1 (*) [16])(*pauVar25 + lVar29);
      }
    }
    lVar18 = lVar18 + 0x80;
  }
  iVar30 = ((int)uVar5 % 0xc & 0xfffffff8U) + iVar30;
  uVar26 = (int)(uVar5 - iVar30) >> 2;
  uVar17 = 0;
  uVar19 = (ulong)uVar26;
  if ((int)uVar26 < 1) {
    uVar19 = uVar17;
  }
  lVar18 = (long)iVar30 * 0x10 + 0x20;
  for (; uVar17 != uVar19; uVar17 = uVar17 + 1) {
    iVar13 = iVar30 + (int)uVar17 * 4;
    cVar7 = (char)(iVar13 % 0xc);
    ppp_Var15 = (_func_int ***)
                ((long)(_func_int ***)local_b8._0_8_ +
                (long)((int)(char)(cVar7 % '\b' >> 2) + iVar13 / 0xc + (int)(cVar7 / '\b')) *
                local_78 * local_b8._16_8_);
    for (uVar23 = 0; uVar23 != uVar28; uVar23 = uVar23 + 1) {
      pauVar25 = (undefined1 (*) [16])
                 ((long)bottom_im2col->data +
                 bottom_im2col->cstep * bottom_im2col->elemsize * uVar23 + lVar18);
      uVar26 = uVar24;
      while (bVar32 = uVar26 != 0, uVar26 = uVar26 - 1, bVar32) {
        auVar38 = vunpcklps_avx(pauVar25[-2],pauVar25[-1]);
        auVar37 = vunpcklps_avx(*pauVar25,pauVar25[1]);
        auVar42 = vunpckhps_avx(pauVar25[-2],pauVar25[-1]);
        auVar36 = vunpckhps_avx(*pauVar25,pauVar25[1]);
        auVar33 = vmovlhps_avx(auVar38,auVar37);
        auVar37 = vunpckhpd_avx(auVar38,auVar37);
        auVar38 = vmovlhps_avx(auVar42,auVar36);
        auVar42 = vunpckhpd_avx(auVar42,auVar36);
        *(undefined1 (*) [16])ppp_Var15 = auVar33;
        *(undefined1 (*) [16])(ppp_Var15 + 2) = auVar37;
        *(undefined1 (*) [16])(ppp_Var15 + 4) = auVar38;
        *(undefined1 (*) [16])(ppp_Var15 + 6) = auVar42;
        ppp_Var15 = ppp_Var15 + 8;
        pauVar25 = (undefined1 (*) [16])(*pauVar25 + lVar29);
      }
    }
    lVar18 = lVar18 + 0x40;
  }
  iVar30 = (uVar5 - iVar30 & 0xfffffffc) + iVar30;
  uVar26 = (int)(uVar5 - iVar30) >> 1;
  uVar17 = 0;
  uVar19 = (ulong)uVar26;
  if ((int)uVar26 < 1) {
    uVar19 = uVar17;
  }
  lVar18 = (long)iVar30 * 0x10 + 0x10;
  for (; uVar17 != uVar19; uVar17 = uVar17 + 1) {
    iVar13 = iVar30 + (int)uVar17 * 2;
    cVar7 = (char)(iVar13 % 0xc);
    ppp_Var15 = (_func_int ***)
                ((long)(_func_int ***)local_b8._0_8_ +
                (long)((int)(char)(cVar7 % '\x04' >> 1) + (int)(cVar7 / '\b') + iVar13 / 0xc +
                      (int)(char)((cVar7 % '\b') / '\x04')) * local_78 * local_b8._16_8_);
    for (uVar23 = 0; uVar23 != uVar28; uVar23 = uVar23 + 1) {
      lVar20 = bottom_im2col->cstep * bottom_im2col->elemsize * uVar23;
      lVar27 = (long)bottom_im2col->data + lVar18;
      uVar26 = uVar24;
      while (bVar32 = uVar26 != 0, uVar26 = uVar26 - 1, bVar32) {
        auVar33 = *(undefined1 (*) [16])(lVar27 + -0x10 + lVar20);
        auVar38 = *(undefined1 (*) [16])(lVar27 + lVar20);
        auVar37 = vunpcklps_avx(auVar33,auVar38);
        auVar33 = vunpckhps_avx(auVar33,auVar38);
        *(undefined1 (*) [16])ppp_Var15 = auVar37;
        *(undefined1 (*) [16])(ppp_Var15 + 2) = auVar33;
        ppp_Var15 = ppp_Var15 + 4;
        lVar27 = lVar27 + lVar29;
      }
    }
    lVar18 = lVar18 + 0x20;
  }
  uVar19 = (ulong)(int)((uVar5 - iVar30 & 0xfffffffe) + iVar30);
  lVar18 = uVar19 << 4;
  for (; (long)uVar19 < lVar14; uVar19 = uVar19 + 1) {
    uVar17 = (ulong)(uint)((int)uVar19 >> 0x1f) << 0x20 | uVar19 & 0xffffffff;
    cVar7 = (char)((long)uVar17 % 0xc);
    ppp_Var15 = (_func_int ***)
                ((long)(_func_int ***)local_b8._0_8_ +
                (long)((int)(cVar7 % '\x02') + (int)((long)uVar17 / 0xc) + (int)(cVar7 / '\b') +
                       (int)(char)((cVar7 % '\b') / '\x04') + (int)(char)((cVar7 % '\x04') / '\x02')
                      ) * local_78 * local_b8._16_8_);
    for (uVar17 = 0; uVar17 != uVar28; uVar17 = uVar17 + 1) {
      pauVar25 = (undefined1 (*) [16])
                 ((long)bottom_im2col->data +
                 bottom_im2col->cstep * bottom_im2col->elemsize * uVar17 + lVar18);
      uVar26 = uVar24;
      while (bVar32 = uVar26 != 0, uVar26 = uVar26 - 1, bVar32) {
        *(undefined1 (*) [16])ppp_Var15 = *pauVar25;
        ppp_Var15 = ppp_Var15 + 2;
        pauVar25 = (undefined1 (*) [16])(*pauVar25 + lVar29);
      }
    }
    lVar18 = lVar18 + 0x10;
  }
  uVar28 = 0;
  uVar19 = (ulong)(uVar16 * uVar6 * 4);
  if ((int)(uVar16 * uVar6 * 4) < 1) {
    uVar19 = uVar28;
  }
  uVar17 = local_60 & 0xffffffff;
  if ((int)local_60 < 1) {
    uVar17 = uVar28;
  }
  for (; uVar28 != uVar17; uVar28 = uVar28 + 1) {
    pauVar31 = (undefined1 (*) [16])
               (local_58->cstep * uVar28 * local_58->elemsize + (long)local_58->data);
    zeros[0] = 0.0;
    zeros[1] = 0.0;
    zeros[2] = 0.0;
    zeros[3] = 0.0;
    pauVar25 = (undefined1 (*) [16])(uVar28 * 0x10 + (long)local_50);
    if (local_50 == (void *)0x0) {
      pauVar25 = (undefined1 (*) [16])zeros;
    }
    for (uVar23 = 0; (long)uVar23 < lVar14 + -0xb; uVar23 = uVar23 + 0xc) {
      ppp_Var15 = (_func_int ***)
                  ((long)(_func_int ***)local_b8._0_8_ + (uVar23 / 0xc) * local_78 * local_b8._16_8_
                  );
      pfVar21 = (float *)(kernel->cstep * uVar28 * kernel->elemsize + (long)kernel->data);
      auVar33 = *pauVar25;
      uVar22 = uVar19;
      auVar38 = auVar33;
      auVar37 = auVar33;
      auVar42 = auVar33;
      auVar36 = auVar33;
      auVar41 = auVar33;
      auVar45 = auVar33;
      auVar48 = auVar33;
      auVar35 = auVar33;
      auVar40 = auVar33;
      auVar44 = auVar33;
      auVar34 = auVar33;
      while (iVar30 = (int)uVar22, uVar22 = (ulong)(iVar30 - 1), iVar30 != 0) {
        fVar4 = *pfVar21;
        fVar2 = pfVar21[1];
        fVar3 = pfVar21[2];
        fVar8 = pfVar21[3];
        fVar1 = *(float *)ppp_Var15;
        auVar60._0_4_ = fVar1 * fVar4 + auVar34._0_4_;
        auVar60._4_4_ = fVar1 * fVar2 + auVar34._4_4_;
        auVar60._8_4_ = fVar1 * fVar3 + auVar34._8_4_;
        auVar60._12_4_ = fVar1 * fVar8 + auVar34._12_4_;
        fVar1 = *(float *)((long)ppp_Var15 + 4);
        auVar34._0_4_ = fVar1 * fVar4 + auVar33._0_4_;
        auVar34._4_4_ = fVar1 * fVar2 + auVar33._4_4_;
        auVar34._8_4_ = fVar1 * fVar3 + auVar33._8_4_;
        auVar34._12_4_ = fVar1 * fVar8 + auVar33._12_4_;
        fVar1 = *(float *)(ppp_Var15 + 1);
        auVar39._0_4_ = fVar1 * fVar4 + auVar38._0_4_;
        auVar39._4_4_ = fVar1 * fVar2 + auVar38._4_4_;
        auVar39._8_4_ = fVar1 * fVar3 + auVar38._8_4_;
        auVar39._12_4_ = fVar1 * fVar8 + auVar38._12_4_;
        fVar1 = *(float *)((long)(ppp_Var15 + 1) + 4);
        auVar43._0_4_ = fVar1 * fVar4 + auVar37._0_4_;
        auVar43._4_4_ = fVar1 * fVar2 + auVar37._4_4_;
        auVar43._8_4_ = fVar1 * fVar3 + auVar37._8_4_;
        auVar43._12_4_ = fVar1 * fVar8 + auVar37._12_4_;
        fVar1 = *(float *)(ppp_Var15 + 2);
        auVar46._0_4_ = fVar1 * fVar4 + auVar42._0_4_;
        auVar46._4_4_ = fVar1 * fVar2 + auVar42._4_4_;
        auVar46._8_4_ = fVar1 * fVar3 + auVar42._8_4_;
        auVar46._12_4_ = fVar1 * fVar8 + auVar42._12_4_;
        fVar1 = *(float *)((long)(ppp_Var15 + 2) + 4);
        auVar49._0_4_ = fVar1 * fVar4 + auVar36._0_4_;
        auVar49._4_4_ = fVar1 * fVar2 + auVar36._4_4_;
        auVar49._8_4_ = fVar1 * fVar3 + auVar36._8_4_;
        auVar49._12_4_ = fVar1 * fVar8 + auVar36._12_4_;
        fVar1 = *(float *)(ppp_Var15 + 3);
        auVar51._0_4_ = fVar1 * fVar4 + auVar41._0_4_;
        auVar51._4_4_ = fVar1 * fVar2 + auVar41._4_4_;
        auVar51._8_4_ = fVar1 * fVar3 + auVar41._8_4_;
        auVar51._12_4_ = fVar1 * fVar8 + auVar41._12_4_;
        fVar1 = *(float *)((long)(ppp_Var15 + 3) + 4);
        auVar53._0_4_ = fVar1 * fVar4 + auVar45._0_4_;
        auVar53._4_4_ = fVar1 * fVar2 + auVar45._4_4_;
        auVar53._8_4_ = fVar1 * fVar3 + auVar45._8_4_;
        auVar53._12_4_ = fVar1 * fVar8 + auVar45._12_4_;
        fVar1 = *(float *)(ppp_Var15 + 4);
        auVar55._0_4_ = fVar1 * fVar4 + auVar48._0_4_;
        auVar55._4_4_ = fVar1 * fVar2 + auVar48._4_4_;
        auVar55._8_4_ = fVar1 * fVar3 + auVar48._8_4_;
        auVar55._12_4_ = fVar1 * fVar8 + auVar48._12_4_;
        fVar1 = *(float *)((long)(ppp_Var15 + 4) + 4);
        auVar57._0_4_ = fVar1 * fVar4 + auVar35._0_4_;
        auVar57._4_4_ = fVar1 * fVar2 + auVar35._4_4_;
        auVar57._8_4_ = fVar1 * fVar3 + auVar35._8_4_;
        auVar57._12_4_ = fVar1 * fVar8 + auVar35._12_4_;
        fVar1 = *(float *)(ppp_Var15 + 5);
        auVar58._0_4_ = fVar1 * fVar4 + auVar40._0_4_;
        auVar58._4_4_ = fVar1 * fVar2 + auVar40._4_4_;
        auVar58._8_4_ = fVar1 * fVar3 + auVar40._8_4_;
        auVar58._12_4_ = fVar1 * fVar8 + auVar40._12_4_;
        fVar1 = *(float *)((long)(ppp_Var15 + 5) + 4);
        auVar59._0_4_ = fVar1 * fVar4 + auVar44._0_4_;
        auVar59._4_4_ = fVar1 * fVar2 + auVar44._4_4_;
        auVar59._8_4_ = fVar1 * fVar3 + auVar44._8_4_;
        auVar59._12_4_ = fVar1 * fVar8 + auVar44._12_4_;
        ppp_Var15 = ppp_Var15 + 6;
        pfVar21 = pfVar21 + 4;
        auVar33 = auVar34;
        auVar38 = auVar39;
        auVar37 = auVar43;
        auVar42 = auVar46;
        auVar36 = auVar49;
        auVar41 = auVar51;
        auVar45 = auVar53;
        auVar48 = auVar55;
        auVar35 = auVar57;
        auVar40 = auVar58;
        auVar44 = auVar59;
        auVar34 = auVar60;
      }
      *pauVar31 = auVar34;
      pauVar31[1] = auVar33;
      pauVar31[2] = auVar38;
      pauVar31[3] = auVar37;
      pauVar31[4] = auVar42;
      pauVar31[5] = auVar36;
      pauVar31[6] = auVar41;
      pauVar31[7] = auVar45;
      pauVar31[8] = auVar48;
      pauVar31[9] = auVar35;
      pauVar31[10] = auVar40;
      pauVar31[0xb] = auVar44;
      pauVar31 = pauVar31 + 0xc;
    }
    while( true ) {
      if ((int)uVar5 <= (int)uVar23 + 7) break;
      lVar29 = local_78 * local_b8._16_8_ *
               (ulong)((int)((uVar23 & 0xffffffff) / 0xc) +
                      ((uint)((uVar23 & 0xffffffff) % 0xc) >> 3));
      auVar33 = *pauVar25;
      lVar18 = 0;
      uVar22 = uVar19;
      auVar38 = auVar33;
      auVar37 = auVar33;
      auVar42 = auVar33;
      auVar36 = auVar33;
      auVar41 = auVar33;
      auVar45 = auVar33;
      auVar48 = auVar33;
      while (iVar30 = (int)uVar22, uVar22 = (ulong)(iVar30 - 1), iVar30 != 0) {
        pfVar21 = (float *)((long)kernel->data + lVar18 + kernel->cstep * uVar28 * kernel->elemsize)
        ;
        fVar4 = *pfVar21;
        fVar2 = pfVar21[1];
        fVar3 = pfVar21[2];
        fVar8 = pfVar21[3];
        fVar1 = *(float *)((long)(_func_int ***)local_b8._0_8_ + lVar18 * 2 + lVar29);
        auVar35._0_4_ = fVar1 * fVar4 + auVar33._0_4_;
        auVar35._4_4_ = fVar1 * fVar2 + auVar33._4_4_;
        auVar35._8_4_ = fVar1 * fVar3 + auVar33._8_4_;
        auVar35._12_4_ = fVar1 * fVar8 + auVar33._12_4_;
        fVar1 = *(float *)((long)(_func_int ***)local_b8._0_8_ + lVar18 * 2 + lVar29 + 4);
        auVar40._0_4_ = fVar1 * fVar4 + auVar38._0_4_;
        auVar40._4_4_ = fVar1 * fVar2 + auVar38._4_4_;
        auVar40._8_4_ = fVar1 * fVar3 + auVar38._8_4_;
        auVar40._12_4_ = fVar1 * fVar8 + auVar38._12_4_;
        fVar1 = *(float *)((long)&((Allocator *)(local_b8._0_8_ + 8))->_vptr_Allocator +
                          lVar18 * 2 + lVar29);
        auVar44._0_4_ = fVar1 * fVar4 + auVar37._0_4_;
        auVar44._4_4_ = fVar1 * fVar2 + auVar37._4_4_;
        auVar44._8_4_ = fVar1 * fVar3 + auVar37._8_4_;
        auVar44._12_4_ = fVar1 * fVar8 + auVar37._12_4_;
        fVar1 = *(float *)((long)&((Allocator *)(local_b8._0_8_ + 8))->_vptr_Allocator +
                          lVar18 * 2 + lVar29 + 4);
        auVar47._0_4_ = fVar1 * fVar4 + auVar42._0_4_;
        auVar47._4_4_ = fVar1 * fVar2 + auVar42._4_4_;
        auVar47._8_4_ = fVar1 * fVar3 + auVar42._8_4_;
        auVar47._12_4_ = fVar1 * fVar8 + auVar42._12_4_;
        fVar1 = *(float *)((long)&((Allocator *)(local_b8._0_8_ + 0x10))->_vptr_Allocator +
                          lVar18 * 2 + lVar29);
        auVar50._0_4_ = fVar1 * fVar4 + auVar36._0_4_;
        auVar50._4_4_ = fVar1 * fVar2 + auVar36._4_4_;
        auVar50._8_4_ = fVar1 * fVar3 + auVar36._8_4_;
        auVar50._12_4_ = fVar1 * fVar8 + auVar36._12_4_;
        fVar1 = *(float *)((long)&((Allocator *)(local_b8._0_8_ + 0x10))->_vptr_Allocator +
                          lVar18 * 2 + lVar29 + 4);
        auVar52._0_4_ = fVar1 * fVar4 + auVar41._0_4_;
        auVar52._4_4_ = fVar1 * fVar2 + auVar41._4_4_;
        auVar52._8_4_ = fVar1 * fVar3 + auVar41._8_4_;
        auVar52._12_4_ = fVar1 * fVar8 + auVar41._12_4_;
        fVar1 = *(float *)((long)&((Allocator *)(local_b8._0_8_ + 0x18))->_vptr_Allocator +
                          lVar18 * 2 + lVar29);
        auVar54._0_4_ = fVar1 * fVar4 + auVar45._0_4_;
        auVar54._4_4_ = fVar1 * fVar2 + auVar45._4_4_;
        auVar54._8_4_ = fVar1 * fVar3 + auVar45._8_4_;
        auVar54._12_4_ = fVar1 * fVar8 + auVar45._12_4_;
        fVar1 = *(float *)((long)&((Allocator *)(local_b8._0_8_ + 0x18))->_vptr_Allocator +
                          lVar18 * 2 + lVar29 + 4);
        auVar56._0_4_ = fVar1 * fVar4 + auVar48._0_4_;
        auVar56._4_4_ = fVar1 * fVar2 + auVar48._4_4_;
        auVar56._8_4_ = fVar1 * fVar3 + auVar48._8_4_;
        auVar56._12_4_ = fVar1 * fVar8 + auVar48._12_4_;
        lVar18 = lVar18 + 0x10;
        auVar33 = auVar35;
        auVar38 = auVar40;
        auVar37 = auVar44;
        auVar42 = auVar47;
        auVar36 = auVar50;
        auVar41 = auVar52;
        auVar45 = auVar54;
        auVar48 = auVar56;
      }
      *pauVar31 = auVar33;
      pauVar31[1] = auVar38;
      pauVar31[2] = auVar37;
      pauVar31[3] = auVar42;
      pauVar31[4] = auVar36;
      pauVar31[5] = auVar41;
      pauVar31[6] = auVar45;
      pauVar31[7] = auVar48;
      pauVar31 = pauVar31 + 8;
      uVar23 = (ulong)((int)uVar23 + 8);
    }
    while( true ) {
      uVar22 = (uVar23 & 0xffffffff) % 0xc;
      if ((int)uVar5 <= (int)((uint)uVar23 | 3)) break;
      lVar29 = local_78 * local_b8._16_8_ *
               (ulong)((int)(uVar22 >> 3) + (int)((uVar23 & 0xffffffff) / 0xc) +
                      (uint)(((uint)uVar22 >> 2 & 1) != 0));
      auVar33 = *pauVar25;
      lVar18 = 0;
      uVar22 = uVar19;
      auVar38 = auVar33;
      auVar37 = auVar33;
      auVar42 = auVar33;
      while (iVar30 = (int)uVar22, uVar22 = (ulong)(iVar30 - 1), iVar30 != 0) {
        pfVar21 = (float *)((long)kernel->data + lVar18 + kernel->cstep * uVar28 * kernel->elemsize)
        ;
        fVar8 = *pfVar21;
        fVar9 = pfVar21[1];
        fVar10 = pfVar21[2];
        fVar11 = pfVar21[3];
        fVar1 = *(float *)((long)(_func_int ***)local_b8._0_8_ + lVar18 + lVar29);
        fVar4 = *(float *)((long)(_func_int ***)local_b8._0_8_ + lVar18 + lVar29 + 4);
        fVar2 = *(float *)((long)&((Allocator *)(local_b8._0_8_ + 8))->_vptr_Allocator +
                          lVar18 + lVar29);
        fVar3 = *(float *)((long)&((Allocator *)(local_b8._0_8_ + 8))->_vptr_Allocator +
                          lVar18 + lVar29 + 4);
        auVar36._0_4_ = fVar1 * fVar8 + auVar33._0_4_;
        auVar36._4_4_ = fVar1 * fVar9 + auVar33._4_4_;
        auVar36._8_4_ = fVar1 * fVar10 + auVar33._8_4_;
        auVar36._12_4_ = fVar1 * fVar11 + auVar33._12_4_;
        auVar41._0_4_ = fVar4 * fVar8 + auVar38._0_4_;
        auVar41._4_4_ = fVar4 * fVar9 + auVar38._4_4_;
        auVar41._8_4_ = fVar4 * fVar10 + auVar38._8_4_;
        auVar41._12_4_ = fVar4 * fVar11 + auVar38._12_4_;
        auVar45._0_4_ = fVar2 * fVar8 + auVar37._0_4_;
        auVar45._4_4_ = fVar2 * fVar9 + auVar37._4_4_;
        auVar45._8_4_ = fVar2 * fVar10 + auVar37._8_4_;
        auVar45._12_4_ = fVar2 * fVar11 + auVar37._12_4_;
        auVar48._0_4_ = fVar3 * fVar8 + auVar42._0_4_;
        auVar48._4_4_ = fVar3 * fVar9 + auVar42._4_4_;
        auVar48._8_4_ = fVar3 * fVar10 + auVar42._8_4_;
        auVar48._12_4_ = fVar3 * fVar11 + auVar42._12_4_;
        lVar18 = lVar18 + 0x10;
        auVar33 = auVar36;
        auVar38 = auVar41;
        auVar37 = auVar45;
        auVar42 = auVar48;
      }
      *pauVar31 = auVar33;
      pauVar31[1] = auVar38;
      pauVar31[2] = auVar37;
      pauVar31[3] = auVar42;
      pauVar31 = pauVar31 + 4;
      uVar23 = (ulong)((uint)uVar23 + 4);
    }
    while( true ) {
      uVar22 = (uVar23 & 0xffffffff) % 0xc;
      if ((int)uVar5 <= (int)((uint)uVar23 | 1)) break;
      pfVar21 = (float *)(kernel->cstep * uVar28 * kernel->elemsize + (long)kernel->data);
      lVar29 = local_78 * local_b8._16_8_ *
               (ulong)(((uint)(uVar22 >> 2) & 1) +
                       (int)(uVar22 >> 3) + (int)((uVar23 & 0xffffffff) / 0xc) +
                      (uint)(((uint)uVar22 >> 1 & 1) != 0));
      auVar33 = *pauVar25;
      auVar38 = *pauVar25;
      for (lVar18 = 0; (int)uVar19 != (int)lVar18; lVar18 = lVar18 + 1) {
        fVar1 = *(float *)((long)&((Allocator *)(local_b8._0_8_ + lVar18 * 8))->_vptr_Allocator +
                          lVar29);
        fVar4 = *(float *)((long)&((Allocator *)(local_b8._0_8_ + lVar18 * 8))->_vptr_Allocator +
                          lVar29 + 4);
        auVar37._0_4_ = fVar1 * *pfVar21 + auVar33._0_4_;
        auVar37._4_4_ = fVar1 * pfVar21[1] + auVar33._4_4_;
        auVar37._8_4_ = fVar1 * pfVar21[2] + auVar33._8_4_;
        auVar37._12_4_ = fVar1 * pfVar21[3] + auVar33._12_4_;
        auVar42._0_4_ = fVar4 * *pfVar21 + auVar38._0_4_;
        auVar42._4_4_ = fVar4 * pfVar21[1] + auVar38._4_4_;
        auVar42._8_4_ = fVar4 * pfVar21[2] + auVar38._8_4_;
        auVar42._12_4_ = fVar4 * pfVar21[3] + auVar38._12_4_;
        pfVar21 = pfVar21 + 4;
        auVar33 = auVar37;
        auVar38 = auVar42;
      }
      *pauVar31 = auVar33;
      pauVar31[1] = auVar38;
      pauVar31 = pauVar31 + 2;
      uVar23 = (ulong)((uint)uVar23 + 2);
    }
    while( true ) {
      uVar16 = (uint)uVar23;
      uVar22 = (uVar23 & 0xffffffff) % 0xc;
      if ((int)uVar5 <= (int)uVar16) break;
      pfVar21 = (float *)(kernel->cstep * uVar28 * kernel->elemsize + (long)kernel->data);
      auVar33 = *pauVar25;
      for (lVar29 = 0; (int)uVar19 != (int)lVar29; lVar29 = lVar29 + 1) {
        fVar1 = *(float *)((long)(_func_int ***)local_b8._0_8_ +
                          lVar29 * 4 +
                          local_78 * local_b8._16_8_ *
                          (ulong)(((uint)(uVar22 >> 2) & 1) +
                                  (uVar16 & 1) + (int)(uVar22 >> 3) +
                                  (int)((uVar23 & 0xffffffff) / 0xc) +
                                 (uint)(((uint)uVar22 >> 1 & 1) != 0)));
        auVar38._0_4_ = fVar1 * *pfVar21 + auVar33._0_4_;
        auVar38._4_4_ = fVar1 * pfVar21[1] + auVar33._4_4_;
        auVar38._8_4_ = fVar1 * pfVar21[2] + auVar33._8_4_;
        auVar38._12_4_ = fVar1 * pfVar21[3] + auVar33._12_4_;
        pfVar21 = pfVar21 + 4;
        auVar33 = auVar38;
      }
      *pauVar31 = auVar33;
      pauVar31 = pauVar31 + 1;
      uVar23 = (ulong)(uVar16 + 1);
    }
  }
  piVar12 = (int *)CONCAT44(local_b8._12_4_,local_b8._8_4_);
  if (piVar12 != (int *)0x0) {
    LOCK();
    *piVar12 = *piVar12 + -1;
    UNLOCK();
    if (*piVar12 == 0) {
      local_68 = (ulong)uVar6;
      if ((Allocator *)local_b8._32_8_ == (Allocator *)0x0) {
        free((void *)local_b8._0_8_);
      }
      else {
        (*(*(_func_int ***)local_b8._32_8_)[3])();
      }
    }
  }
  return;
}

Assistant:

static void im2col_sgemm_pack4_sse(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    // Mat bottom_im2col(size, maxk, inch, 4u * 4, 4, opt.workspace_allocator);

    const int size = bottom_im2col.w;
    const int maxk = bottom_im2col.h;
    const int inch = bottom_im2col.c;

    const int outch = top_blob.c;

    const float* bias = _bias;

    // permute
    Mat tmp;
    if (size >= 12)
        tmp.create(12 * maxk, inch, size / 12 + (size % 12) / 8 + (size % 12 % 8) / 4 + (size % 12 % 4) / 2 + size % 12 % 2, 4u * 4, 4, opt.workspace_allocator);
    else if (size >= 8)
        tmp.create(8 * maxk, inch, size / 8 + (size % 8) / 4 + (size % 4) / 2 + size % 2, 4u * 4, 4, opt.workspace_allocator);
    else if (size >= 4)
        tmp.create(4 * maxk, inch, size / 4 + (size % 4) / 2 + size % 2, 4u * 4, 4, opt.workspace_allocator);
    else if (size >= 2)
        tmp.create(2 * maxk, inch, size / 2 + size % 2, 4u * 4, 4, opt.workspace_allocator);
    else
        tmp.create(maxk, inch, size, 4u * 4, 4, opt.workspace_allocator);
    {
        int remain_size_start = 0;
        int nn_size = size / 12;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 12;

            float* tmpptr = tmp.channel(i / 12);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i * 4;

                for (int k = 0; k < maxk; k++)
                {
                    // transpose 4x12
                    __m128 _r0 = _mm_load_ps(img0);
                    __m128 _r1 = _mm_load_ps(img0 + 4);
                    __m128 _r2 = _mm_load_ps(img0 + 4 * 2);
                    __m128 _r3 = _mm_load_ps(img0 + 4 * 3);
                    __m128 _r4 = _mm_load_ps(img0 + 4 * 4);
                    __m128 _r5 = _mm_load_ps(img0 + 4 * 5);
                    __m128 _r6 = _mm_load_ps(img0 + 4 * 6);
                    __m128 _r7 = _mm_load_ps(img0 + 4 * 7);
                    __m128 _r8 = _mm_load_ps(img0 + 4 * 8);
                    __m128 _r9 = _mm_load_ps(img0 + 4 * 9);
                    __m128 _ra = _mm_load_ps(img0 + 4 * 10);
                    __m128 _rb = _mm_load_ps(img0 + 4 * 11);

                    _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                    _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                    _MM_TRANSPOSE4_PS(_r8, _r9, _ra, _rb);

                    _mm_store_ps(tmpptr, _r0);
                    _mm_store_ps(tmpptr + 4, _r4);
                    _mm_store_ps(tmpptr + 4 * 2, _r8);
                    _mm_store_ps(tmpptr + 4 * 3, _r1);
                    _mm_store_ps(tmpptr + 4 * 4, _r5);
                    _mm_store_ps(tmpptr + 4 * 5, _r9);
                    _mm_store_ps(tmpptr + 4 * 6, _r2);
                    _mm_store_ps(tmpptr + 4 * 7, _r6);
                    _mm_store_ps(tmpptr + 4 * 8, _ra);
                    _mm_store_ps(tmpptr + 4 * 9, _r3);
                    _mm_store_ps(tmpptr + 4 * 10, _r7);
                    _mm_store_ps(tmpptr + 4 * 11, _rb);

                    img0 += size * 4;
                    tmpptr += 48;
                }
            }
        }

        remain_size_start += nn_size * 12;
        nn_size = (size - remain_size_start) >> 3;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 8;

            float* tmpptr = tmp.channel(i / 12 + (i % 12) / 8);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i * 4;

                for (int k = 0; k < maxk; k++)
                {
                    // transpose 4x8
                    __m128 _r0 = _mm_load_ps(img0);
                    __m128 _r1 = _mm_load_ps(img0 + 4);
                    __m128 _r2 = _mm_load_ps(img0 + 4 * 2);
                    __m128 _r3 = _mm_load_ps(img0 + 4 * 3);
                    __m128 _r4 = _mm_load_ps(img0 + 4 * 4);
                    __m128 _r5 = _mm_load_ps(img0 + 4 * 5);
                    __m128 _r6 = _mm_load_ps(img0 + 4 * 6);
                    __m128 _r7 = _mm_load_ps(img0 + 4 * 7);

                    _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                    _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);

                    _mm_store_ps(tmpptr, _r0);
                    _mm_store_ps(tmpptr + 4, _r4);
                    _mm_store_ps(tmpptr + 4 * 2, _r1);
                    _mm_store_ps(tmpptr + 4 * 3, _r5);
                    _mm_store_ps(tmpptr + 4 * 4, _r2);
                    _mm_store_ps(tmpptr + 4 * 5, _r6);
                    _mm_store_ps(tmpptr + 4 * 6, _r3);
                    _mm_store_ps(tmpptr + 4 * 7, _r7);

                    img0 += size * 4;
                    tmpptr += 32;
                }
            }
        }

        remain_size_start += nn_size << 3;
        nn_size = (size - remain_size_start) >> 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 4;

            float* tmpptr = tmp.channel(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i * 4;

                for (int k = 0; k < maxk; k++)
                {
                    // transpose 4x4
                    __m128 _r0 = _mm_load_ps(img0);
                    __m128 _r1 = _mm_load_ps(img0 + 4);
                    __m128 _r2 = _mm_load_ps(img0 + 4 * 2);
                    __m128 _r3 = _mm_load_ps(img0 + 4 * 3);

                    _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);

                    _mm_store_ps(tmpptr, _r0);
                    _mm_store_ps(tmpptr + 4, _r1);
                    _mm_store_ps(tmpptr + 4 * 2, _r2);
                    _mm_store_ps(tmpptr + 4 * 3, _r3);

                    img0 += size * 4;
                    tmpptr += 16;
                }
            }
        }

        remain_size_start += nn_size << 2;
        nn_size = (size - remain_size_start) >> 1;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 2;

            float* tmpptr = tmp.channel(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4 + (i % 12 % 4) / 2);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i * 4;

                for (int k = 0; k < maxk; k++)
                {
                    // transpose 4x2
                    __m128 _r0 = _mm_load_ps(img0);
                    __m128 _r1 = _mm_load_ps(img0 + 4);

                    __m128 _r01_0 = _mm_unpacklo_ps(_r0, _r1);
                    __m128 _r01_1 = _mm_unpackhi_ps(_r0, _r1);

                    _mm_store_ps(tmpptr, _r01_0);
                    _mm_store_ps(tmpptr + 4, _r01_1);

                    img0 += size * 4;
                    tmpptr += 8;
                }
            }
        }

        remain_size_start += nn_size << 1;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < size; i++)
        {
            float* tmpptr = tmp.channel(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4 + (i % 12 % 4) / 2 + i % 12 % 2);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i * 4;

                for (int k = 0; k < maxk; k++)
                {
                    __m128 _val = _mm_load_ps(img0);
                    _mm_store_ps(tmpptr, _val);

                    img0 += size * 4;
                    tmpptr += 4;
                }
            }
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* outptr0 = top_blob.channel(p);

        const float zeros[4] = {0.f, 0.f, 0.f, 0.f};
        const float* biasptr = bias ? bias + p * 4 : zeros;

        int i = 0;
        for (; i + 11 < size; i += 12)
        {
            const float* tmpptr = tmp.channel(i / 12);
            const float* kptr0 = kernel.channel(p);

            int nn = inch * maxk * 4; // inch always > 0

            __m128 _sum0 = _mm_loadu_ps(biasptr);
            __m128 _sum1 = _sum0;
            __m128 _sum2 = _sum0;
            __m128 _sum3 = _sum0;
            __m128 _sum4 = _sum0;
            __m128 _sum5 = _sum0;
            __m128 _sum6 = _sum0;
            __m128 _sum7 = _sum0;
            __m128 _sum8 = _sum0;
            __m128 _sum9 = _sum0;
            __m128 _suma = _sum0;
            __m128 _sumb = _sum0;

            for (int j = 0; j < nn; j++)
            {
                __m128 _w0 = _mm_load_ps(kptr0);

                __m128 _val0 = _mm_load1_ps(tmpptr);
                __m128 _val1 = _mm_load1_ps(tmpptr + 1);
                __m128 _val2 = _mm_load1_ps(tmpptr + 2);
                __m128 _val3 = _mm_load1_ps(tmpptr + 3);
                __m128 _val4 = _mm_load1_ps(tmpptr + 4);
                __m128 _val5 = _mm_load1_ps(tmpptr + 5);
                __m128 _val6 = _mm_load1_ps(tmpptr + 6);
                __m128 _val7 = _mm_load1_ps(tmpptr + 7);
                __m128 _val8 = _mm_load1_ps(tmpptr + 8);
                __m128 _val9 = _mm_load1_ps(tmpptr + 9);
                __m128 _vala = _mm_load1_ps(tmpptr + 10);
                __m128 _valb = _mm_load1_ps(tmpptr + 11);

                _sum0 = _mm_comp_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm_comp_fmadd_ps(_val1, _w0, _sum1);
                _sum2 = _mm_comp_fmadd_ps(_val2, _w0, _sum2);
                _sum3 = _mm_comp_fmadd_ps(_val3, _w0, _sum3);
                _sum4 = _mm_comp_fmadd_ps(_val4, _w0, _sum4);
                _sum5 = _mm_comp_fmadd_ps(_val5, _w0, _sum5);
                _sum6 = _mm_comp_fmadd_ps(_val6, _w0, _sum6);
                _sum7 = _mm_comp_fmadd_ps(_val7, _w0, _sum7);
                _sum8 = _mm_comp_fmadd_ps(_val8, _w0, _sum8);
                _sum9 = _mm_comp_fmadd_ps(_val9, _w0, _sum9);
                _suma = _mm_comp_fmadd_ps(_vala, _w0, _suma);
                _sumb = _mm_comp_fmadd_ps(_valb, _w0, _sumb);

                tmpptr += 12;
                kptr0 += 4;
            }

            _mm_store_ps(outptr0, _sum0);
            _mm_store_ps(outptr0 + 4, _sum1);
            _mm_store_ps(outptr0 + 4 * 2, _sum2);
            _mm_store_ps(outptr0 + 4 * 3, _sum3);
            _mm_store_ps(outptr0 + 4 * 4, _sum4);
            _mm_store_ps(outptr0 + 4 * 5, _sum5);
            _mm_store_ps(outptr0 + 4 * 6, _sum6);
            _mm_store_ps(outptr0 + 4 * 7, _sum7);
            _mm_store_ps(outptr0 + 4 * 8, _sum8);
            _mm_store_ps(outptr0 + 4 * 9, _sum9);
            _mm_store_ps(outptr0 + 4 * 10, _suma);
            _mm_store_ps(outptr0 + 4 * 11, _sumb);

            outptr0 += 4 * 12;
        }
        for (; i + 7 < size; i += 8)
        {
            const float* tmpptr = tmp.channel(i / 12 + (i % 12) / 8);
            const float* kptr0 = kernel.channel(p);

            int nn = inch * maxk * 4; // inch always > 0

            __m128 _sum0 = _mm_loadu_ps(biasptr);
            __m128 _sum1 = _sum0;
            __m128 _sum2 = _sum0;
            __m128 _sum3 = _sum0;
            __m128 _sum4 = _sum0;
            __m128 _sum5 = _sum0;
            __m128 _sum6 = _sum0;
            __m128 _sum7 = _sum0;

            for (int j = 0; j < nn; j++)
            {
                __m128 _w0 = _mm_load_ps(kptr0);

                __m128 _val0 = _mm_load1_ps(tmpptr);
                __m128 _val1 = _mm_load1_ps(tmpptr + 1);
                __m128 _val2 = _mm_load1_ps(tmpptr + 2);
                __m128 _val3 = _mm_load1_ps(tmpptr + 3);
                __m128 _val4 = _mm_load1_ps(tmpptr + 4);
                __m128 _val5 = _mm_load1_ps(tmpptr + 5);
                __m128 _val6 = _mm_load1_ps(tmpptr + 6);
                __m128 _val7 = _mm_load1_ps(tmpptr + 7);

                _sum0 = _mm_comp_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm_comp_fmadd_ps(_val1, _w0, _sum1);
                _sum2 = _mm_comp_fmadd_ps(_val2, _w0, _sum2);
                _sum3 = _mm_comp_fmadd_ps(_val3, _w0, _sum3);
                _sum4 = _mm_comp_fmadd_ps(_val4, _w0, _sum4);
                _sum5 = _mm_comp_fmadd_ps(_val5, _w0, _sum5);
                _sum6 = _mm_comp_fmadd_ps(_val6, _w0, _sum6);
                _sum7 = _mm_comp_fmadd_ps(_val7, _w0, _sum7);

                tmpptr += 8;
                kptr0 += 4;
            }

            _mm_store_ps(outptr0, _sum0);
            _mm_store_ps(outptr0 + 4, _sum1);
            _mm_store_ps(outptr0 + 4 * 2, _sum2);
            _mm_store_ps(outptr0 + 4 * 3, _sum3);
            _mm_store_ps(outptr0 + 4 * 4, _sum4);
            _mm_store_ps(outptr0 + 4 * 5, _sum5);
            _mm_store_ps(outptr0 + 4 * 6, _sum6);
            _mm_store_ps(outptr0 + 4 * 7, _sum7);

            outptr0 += 4 * 8;
        }
        for (; i + 3 < size; i += 4)
        {
            const float* tmpptr = tmp.channel(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4);
            const float* kptr0 = kernel.channel(p);

            int nn = inch * maxk * 4; // inch always > 0

            __m128 _sum0 = _mm_loadu_ps(biasptr);
            __m128 _sum1 = _sum0;
            __m128 _sum2 = _sum0;
            __m128 _sum3 = _sum0;

            for (int j = 0; j < nn; j++)
            {
                __m128 _w0 = _mm_load_ps(kptr0);

                __m128 _val0 = _mm_load1_ps(tmpptr);
                __m128 _val1 = _mm_load1_ps(tmpptr + 1);
                __m128 _val2 = _mm_load1_ps(tmpptr + 2);
                __m128 _val3 = _mm_load1_ps(tmpptr + 3);

                _sum0 = _mm_comp_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm_comp_fmadd_ps(_val1, _w0, _sum1);
                _sum2 = _mm_comp_fmadd_ps(_val2, _w0, _sum2);
                _sum3 = _mm_comp_fmadd_ps(_val3, _w0, _sum3);

                tmpptr += 4;
                kptr0 += 4;
            }

            _mm_store_ps(outptr0, _sum0);
            _mm_store_ps(outptr0 + 4, _sum1);
            _mm_store_ps(outptr0 + 4 * 2, _sum2);
            _mm_store_ps(outptr0 + 4 * 3, _sum3);

            outptr0 += 4 * 4;
        }
        for (; i + 1 < size; i += 2)
        {
            const float* tmpptr = tmp.channel(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4 + (i % 12 % 4) / 2);
            const float* kptr0 = kernel.channel(p);

            int nn = inch * maxk * 4; // inch always > 0

            __m128 _sum0 = _mm_loadu_ps(biasptr);
            __m128 _sum1 = _sum0;

            for (int j = 0; j < nn; j++)
            {
                __m128 _w0 = _mm_load_ps(kptr0);

                __m128 _val0 = _mm_load1_ps(tmpptr);
                __m128 _val1 = _mm_load1_ps(tmpptr + 1);

                _sum0 = _mm_comp_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm_comp_fmadd_ps(_val1, _w0, _sum1);

                tmpptr += 2;
                kptr0 += 4;
            }

            _mm_store_ps(outptr0, _sum0);
            _mm_store_ps(outptr0 + 4, _sum1);

            outptr0 += 4 * 2;
        }
        for (; i < size; i++)
        {
            const float* tmpptr = tmp.channel(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4 + (i % 12 % 4) / 2 + i % 12 % 2);
            const float* kptr0 = kernel.channel(p);

            int nn = inch * maxk * 4; // inch always > 0

            __m128 _sum = _mm_loadu_ps(biasptr);

            for (int j = 0; j < nn; j++)
            {
                __m128 _w0 = _mm_load_ps(kptr0);
                __m128 _val0 = _mm_load1_ps(tmpptr);
                _sum = _mm_comp_fmadd_ps(_val0, _w0, _sum);

                tmpptr += 1;
                kptr0 += 4;
            }

            _mm_store_ps(outptr0, _sum);

            outptr0 += 4;
        }
    }
}